

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

Vec_Int_t * Llb_Nonlin4SweepOrder(Aig_Man_t *pAig,int *pCounter,int fSaveAll)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  int local_38;
  int local_34;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vOrder;
  int *piStack_18;
  int fSaveAll_local;
  int *pCounter_local;
  Aig_Man_t *pAig_local;
  
  local_38 = 0;
  vOrder._4_4_ = fSaveAll;
  piStack_18 = pCounter;
  pCounter_local = (int *)pAig;
  iVar2 = Aig_ManObjNumMax(pAig);
  pObj = (Aig_Obj_t *)Vec_IntStartFull(iVar2);
  Aig_ManIncrementTravId((Aig_Man_t *)pCounter_local);
  piVar1 = pCounter_local;
  pAVar5 = Aig_ManConst1((Aig_Man_t *)pCounter_local);
  Aig_ObjSetTravIdCurrent((Aig_Man_t *)piVar1,pAVar5);
  for (local_34 = 0; iVar2 = local_34, iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)(pCounter_local + 6)),
      iVar2 < iVar3; local_34 = local_34 + 1) {
    _Counter = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(pCounter_local + 6),local_34);
    pAVar5 = pObj;
    iVar3 = Aig_ObjId(_Counter);
    iVar2 = local_38;
    local_38 = local_38 + 1;
    Vec_IntWriteEntry((Vec_Int_t *)pAVar5,iVar3,iVar2);
    piVar1 = pCounter_local;
    pAVar5 = Aig_ObjFanin0(_Counter);
    Llb_Nonlin4SweepOrder_rec((Aig_Man_t *)piVar1,pAVar5,(Vec_Int_t *)pObj,&local_38,vOrder._4_4_);
  }
  for (local_34 = 0; iVar3 = local_34, iVar4 = Vec_PtrSize(*(Vec_Ptr_t **)(pCounter_local + 4)),
      iVar2 = local_38, iVar3 < iVar4; local_34 = local_34 + 1) {
    _Counter = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(pCounter_local + 4),local_34);
    iVar2 = Llb_ObjBddVar((Vec_Int_t *)pObj,_Counter);
    pAVar5 = pObj;
    if (iVar2 < 0) {
      iVar3 = Aig_ObjId(_Counter);
      iVar2 = local_38;
      local_38 = local_38 + 1;
      Vec_IntWriteEntry((Vec_Int_t *)pAVar5,iVar3,iVar2);
    }
  }
  if (piStack_18 != (int *)0x0) {
    iVar3 = Aig_ManCiNum((Aig_Man_t *)pCounter_local);
    iVar4 = Aig_ManCoNum((Aig_Man_t *)pCounter_local);
    *piStack_18 = (iVar2 - iVar3) - iVar4;
  }
  return (Vec_Int_t *)pObj;
}

Assistant:

Vec_Int_t * Llb_Nonlin4SweepOrder( Aig_Man_t * pAig, int * pCounter, int fSaveAll )
{
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    // collect nodes in the order
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Aig_ManForEachCo( pAig, pObj, i )
    {
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        Llb_Nonlin4SweepOrder_rec( pAig, Aig_ObjFanin0(pObj), vOrder, &Counter, fSaveAll );
    }
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) < 0 )
            Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
//    assert( Counter == Aig_ManObjNum(pAig) - 1 ); // no dangling nodes
    if ( pCounter )
        *pCounter = Counter - Aig_ManCiNum(pAig) - Aig_ManCoNum(pAig);
    return vOrder;
}